

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_3dVector::LengthAndUnitize(ON_3dVector *this)

{
  double dVar1;
  undefined1 local_38 [8];
  ON_3dVector tmp;
  double len;
  double d;
  ON_3dVector *this_local;
  
  dVar1 = Length(this);
  tmp.z = dVar1;
  if (dVar1 <= 2.2250738585072014e-308) {
    if ((dVar1 <= 0.0) ||
       (tmp.z._6_2_ = (ushort)((ulong)dVar1 >> 0x30), (tmp.z._6_2_ & 0x7ff0) == 0x7ff0)) {
      tmp.z = 0.0;
      this->x = 0.0;
      this->y = 0.0;
      this->z = 0.0;
    }
    else {
      local_38 = (undefined1  [8])(this->x * 8.98846567431158e+307);
      tmp.x = this->y * 8.98846567431158e+307;
      tmp.y = this->z * 8.98846567431158e+307;
      dVar1 = Length((ON_3dVector *)local_38);
      if (dVar1 <= 2.2250738585072014e-308) {
        tmp.z = 0.0;
        this->x = 0.0;
        this->y = 0.0;
        this->z = 0.0;
      }
      else {
        dVar1 = 1.0 / dVar1;
        this->x = (double)local_38 * dVar1;
        this->y = tmp.x * dVar1;
        this->z = tmp.y * dVar1;
      }
    }
  }
  else {
    dVar1 = 1.0 / dVar1;
    this->x = dVar1 * this->x;
    this->y = dVar1 * this->y;
    this->z = dVar1 * this->z;
  }
  return tmp.z;
}

Assistant:

double ON_3dVector::LengthAndUnitize()
{
  double d;
  double len = Length();
  if ( len > ON_DBL_MIN )
  {
    d = 1.0/len;
    x *= d;
    y *= d;
    z *= d;
  }
  else if ( len > 0.0 && ON_IS_FINITE(len) )
  {
    // This code is rarely used and can be slow.
    // It multiplies by 2^1023 in an attempt to 
    // normalize the coordinates.
    // If the renormalization works, then we're
    // ok.  If the renormalization fails, we
    // return false.
    ON_3dVector tmp;
    tmp.x = x*8.9884656743115795386465259539451e+307;
    tmp.y = y*8.9884656743115795386465259539451e+307;
    tmp.z = z*8.9884656743115795386465259539451e+307;
    d = tmp.Length();
    if ( d > ON_DBL_MIN )
    {
      d = 1.0/d;
      x = tmp.x*d;
      y = tmp.y*d;
      z = tmp.z*d;
    }
    else
    {
      len = 0.0;
      x = 0.0;
      y = 0.0;
      z = 0.0;
    }
  }
  else
  {
    len = 0.0;
    x = 0.0;
    y = 0.0;
    z = 0.0;
  }

  return len;
}